

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O0

void __thiscall
GraphContigger::pop_all_error_bubbles
          (GraphContigger *this,GraphEditor *ge,PairedReadsDatastore *peds,int size,bool apply)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint64_t uVar5;
  sgNodeID_t sVar6;
  undefined4 extraout_var;
  reference this_00;
  undefined4 extraout_var_00;
  ostream *poVar7;
  int in_ECX;
  byte in_R8B;
  NodeView *nv;
  iterator __end1;
  iterator __begin1;
  NodeView *in_stack_000000d0;
  NodeView *in_stack_000000d8;
  GraphEditor *in_stack_000000e0;
  vector<NodeView,_std::allocator<NodeView>_> *__range1;
  int solved;
  int total;
  NodeView *in_stack_00000318;
  GraphEditor *in_stack_000003e0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined7 in_stack_ffffffffffffff00;
  byte in_stack_ffffffffffffff07;
  bool in_stack_ffffffffffffff66;
  bool in_stack_ffffffffffffff67;
  DistanceGraph *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  byte in_stack_ffffffffffffff77;
  vector<NodeView,_std::allocator<NodeView>_> local_88;
  reference local_60;
  NodeView *local_58;
  __normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_> local_50;
  undefined1 local_48 [24];
  undefined1 *local_30;
  int iVar8;
  int iVar9;
  
  iVar9 = 0;
  iVar8 = 0;
  DistanceGraph::get_all_nodeviews
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff67,in_stack_ffffffffffffff66);
  local_30 = local_48;
  local_50._M_current =
       (NodeView *)
       std::vector<NodeView,_std::allocator<NodeView>_>::begin
                 ((vector<NodeView,_std::allocator<NodeView>_> *)
                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_58 = (NodeView *)
             std::vector<NodeView,_std::allocator<NodeView>_>::end
                       ((vector<NodeView,_std::allocator<NodeView>_> *)
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>
                             *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>
                             *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)), bVar1
        ) {
    local_60 = __gnu_cxx::
               __normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>::
               operator*(&local_50);
    in_stack_ffffffffffffff77 = 0;
    uVar5 = NodeView::size((NodeView *)0x4c424b);
    bVar1 = false;
    if (uVar5 <= (ulong)(long)in_ECX) {
      bVar2 = NodeView::is_bubble_side((NodeView *)CONCAT44(iVar9,iVar8));
      bVar1 = false;
      if (bVar2) {
        sVar6 = NodeView::node_id(local_60);
        iVar3 = std::abs((int)sVar6);
        NodeView::parallels(in_stack_00000318);
        in_stack_ffffffffffffff77 = 1;
        this_00 = std::vector<NodeView,_std::allocator<NodeView>_>::operator[](&local_88,0);
        sVar6 = NodeView::node_id(this_00);
        iVar4 = std::abs((int)sVar6);
        bVar1 = CONCAT44(extraout_var,iVar3) < CONCAT44(extraout_var_00,iVar4);
      }
    }
    if ((in_stack_ffffffffffffff77 & 1) != 0) {
      std::vector<NodeView,_std::allocator<NodeView>_>::~vector
                ((vector<NodeView,_std::allocator<NodeView>_> *)
                 CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    }
    if (bVar1) {
      iVar9 = iVar9 + 1;
      NodeView::parallels(in_stack_00000318);
      std::vector<NodeView,_std::allocator<NodeView>_>::operator[]
                ((vector<NodeView,_std::allocator<NodeView>_> *)&stack0xffffffffffffff58,0);
      in_stack_fffffffffffffef0 = 10;
      in_stack_fffffffffffffee8 = 10;
      in_stack_ffffffffffffff07 =
           pop_error_bubbble((GraphContigger *)__range1,in_stack_000000e0,in_stack_000000d8,
                             in_stack_000000d0,(PairedReadsDatastore *)__begin1._M_current,
                             __end1._M_current._4_4_,(int)peds,(int)ge,__end1._M_current._3_1_);
      std::vector<NodeView,_std::allocator<NodeView>_>::~vector
                ((vector<NodeView,_std::allocator<NodeView>_> *)
                 CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      if ((in_stack_ffffffffffffff07 & 1) != 0) {
        iVar8 = iVar8 + 1;
      }
    }
    __gnu_cxx::__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>::
    operator++(&local_50);
  }
  std::vector<NodeView,_std::allocator<NodeView>_>::~vector
            ((vector<NodeView,_std::allocator<NodeView>_> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
  poVar7 = std::operator<<(poVar7,"/");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
  poVar7 = std::operator<<(poVar7," canonical repeats solved!");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  if ((in_R8B & 1) != 0) {
    GraphEditor::apply_all(in_stack_000003e0);
    SequenceDistanceGraph::join_all_unitigs
              ((SequenceDistanceGraph *)
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  }
  return;
}

Assistant:

void GraphContigger::pop_all_error_bubbles(GraphEditor &ge, PairedReadsDatastore &peds, int size, bool apply){
    int total=0;
    int solved=0;
    for (auto &nv: ws.sdg.get_all_nodeviews()){
        if (nv.size()<=size and nv.is_bubble_side() and std::abs(nv.node_id())<std::abs(nv.parallels()[0].node_id())) {
            total++;
            if (pop_error_bubbble(ge, nv, nv.parallels()[0], peds)){
                solved++;
            }
        }
    }
    std::cout << solved << "/" << total << " canonical repeats solved!" << std::endl;
    if (apply) {
        ge.apply_all();
        ws.sdg.join_all_unitigs();
    }
}